

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_87c1cb::ExternalPartitionTestDfsAPI_EncodeMatch_Test::TestBody
          (ExternalPartitionTestDfsAPI_EncodeMatch_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  ExternalPartitionTestDfsAPI *in_RDI;
  char *file;
  char *message;
  AssertionResult gtest_ar;
  double psnr2;
  HasNewFatalFailureHelper gtest_fatal_failure_checker_1;
  double psnr;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  double in_stack_000001e8;
  char *in_stack_000001f0;
  char *in_stack_000001f8;
  Y4mVideoSource *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  undefined4 uVar3;
  int line;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4d;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  AssertionResult local_190;
  char *local_180;
  TestPartResultReporterInterface in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  int local_134;
  HasNewFatalFailureHelper local_130;
  allocator local_101;
  string local_100 [32];
  undefined1 local_e0 [224];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"paris_352_288_30.y4m",&local_101);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)in_RDI,
             (string *)
             CONCAT17(in_stack_fffffffffffffe4f,
                      CONCAT16(in_stack_fffffffffffffe4e,
                               CONCAT15(in_stack_fffffffffffffe4d,
                                        CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48
                                                )))),
             (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),(int)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  ExternalPartitionTestDfsAPI::SetExternalPartition(in_RDI,false);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_RDI);
    in_stack_fffffffffffffe4e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe4e) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_e0);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_130);
    in_stack_fffffffffffffe4d = bVar2;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffe20);
    if (!bVar2) {
      file = (char *)ExternalPartitionTestDfsAPI::GetAveragePsnr(in_RDI);
      ExternalPartitionTestDfsAPI::SetExternalPartition(in_RDI,true);
      bVar2 = testing::internal::AlwaysTrue();
      line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe3c);
      if (bVar2) {
        testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)in_RDI);
        bVar2 = testing::internal::AlwaysTrue();
        uVar3 = CONCAT13((char)((uint)line >> 0x18),CONCAT12(bVar2,(short)line));
        if (bVar2) {
          (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_e0);
        }
        bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                          ((HasNewFatalFailureHelper *)&stack0xfffffffffffffe98);
        line = CONCAT22((short)((uint)uVar3 >> 0x10),CONCAT11(bVar2,(char)uVar3));
        if (bVar2) {
          local_134 = 3;
        }
        else {
          local_134 = 0;
        }
        testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                  ((HasNewFatalFailureHelper *)in_stack_fffffffffffffe20);
        if (local_134 == 0) {
          message = (char *)ExternalPartitionTestDfsAPI::GetAveragePsnr(in_RDI);
          local_180 = message;
          testing::internal::CmpHelperFloatingPointEQ<double>
                    (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,(double)this);
          bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_190);
          if (!bVar2) {
            testing::Message::Message((Message *)in_RDI);
            in_stack_fffffffffffffe20 =
                 (Y4mVideoSource *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x74cc52);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_RDI,
                       CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe4e,
                                               CONCAT11(in_stack_fffffffffffffe4d,
                                                        in_stack_fffffffffffffe4c))),file,line,
                       message);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffea0,
                       (Message *)in_stack_fffffffffffffe98._vptr_TestPartResultReporterInterface);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe20);
            testing::Message::~Message((Message *)0x74cca0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x74ccec);
          goto LAB_0074ccf7;
        }
        if (local_134 != 3) goto LAB_0074ccf7;
      }
      testing::Message::Message((Message *)in_RDI);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_RDI,
                 CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe4e,
                                         CONCAT11(in_stack_fffffffffffffe4d,
                                                  in_stack_fffffffffffffe4c))),file,line,
                 in_stack_fffffffffffffe30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,
                 (Message *)in_stack_fffffffffffffe98._vptr_TestPartResultReporterInterface);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x74cb6a);
      goto LAB_0074ccf7;
    }
    if (!bVar2) goto LAB_0074ccf7;
  }
  testing::Message::Message((Message *)in_RDI);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_RDI,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe4e,
                                     CONCAT11(in_stack_fffffffffffffe4d,in_stack_fffffffffffffe4c)))
             ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffea0,
             (Message *)in_stack_fffffffffffffe98._vptr_TestPartResultReporterInterface);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x74c99c);
LAB_0074ccf7:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(in_stack_fffffffffffffe20);
  return;
}

Assistant:

TEST_P(ExternalPartitionTestDfsAPI, EncodeMatch) {
  ::libaom_test::Y4mVideoSource video("paris_352_288_30.y4m", 0, kFrameNum);
  SetExternalPartition(false);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr = GetAveragePsnr();

  SetExternalPartition(true);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr2 = GetAveragePsnr();

  EXPECT_DOUBLE_EQ(psnr, psnr2);
}